

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O0

void __thiscall
HttpResponse::HttpResponse(HttpResponse *this,string *responseData,URL *originalURL,Log *log)

{
  bool bVar1;
  StringBufferHelper *this_00;
  allocator local_161;
  string local_160 [39];
  allocator local_139;
  string local_138 [39];
  undefined1 local_111;
  string local_110 [39];
  allocator local_e9;
  string local_e8 [32];
  string local_c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8 [39];
  allocator local_81;
  string local_80 [39];
  allocator local_59;
  string local_58 [48];
  Log *local_28;
  Log *log_local;
  URL *originalURL_local;
  string *responseData_local;
  HttpResponse *this_local;
  
  local_28 = log;
  log_local = (Log *)originalURL;
  originalURL_local = (URL *)responseData;
  responseData_local = (string *)this;
  std::__cxx11::string::string((string *)&this->_httpStatusCode);
  std::__cxx11::string::string((string *)&this->_httpStatusText);
  std::__cxx11::string::string((string *)&this->_httpVersion);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->_headerMap);
  Log::Log(&this->_log);
  Log::operator=(&this->_log,log);
  this->_requestURL = (URL *)log_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"HttpResponse",&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"Starting parsing",&local_81);
  Log::Add(&this->_log,(string *)local_58,(string *)local_80);
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::__cxx11::string::substr((ulong)local_a8,(ulong)responseData);
  bVar1 = std::operator==(local_a8,"ERROR");
  std::__cxx11::string::~string((string *)local_a8);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)&this->_httpStatusCode,"999");
    std::__cxx11::string::size();
    std::__cxx11::string::substr((ulong)local_c8,(ulong)responseData);
    std::__cxx11::string::operator=((string *)&this->_httpStatusText,local_c8);
    std::__cxx11::string::~string(local_c8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_e8,"Client handled error occured",&local_e9);
    Log::Add(&this->_log,(string *)local_e8);
    std::__cxx11::string::~string(local_e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_e9);
  }
  else {
    this_00 = (StringBufferHelper *)operator_new(0x28);
    local_111 = 1;
    std::__cxx11::string::string(local_110,(string *)responseData);
    StringBufferHelper::StringBufferHelper(this_00,(string *)local_110);
    local_111 = 0;
    this->_pRawBuffer = this_00;
    std::__cxx11::string::~string(local_110);
    parseHttpResponseData(this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_138,"HttpResponse",&local_139);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_160,"Parsing of response went ok",&local_161);
    Log::Add(&this->_log,(string *)local_138,(string *)local_160);
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator((allocator<char> *)&local_161);
    std::__cxx11::string::~string(local_138);
    std::allocator<char>::~allocator((allocator<char> *)&local_139);
  }
  return;
}

Assistant:

HttpResponse::HttpResponse(string responseData, URL* originalURL,
                            Log log) {
  _log = log;
  _requestURL = originalURL;
  _log.Add("HttpResponse", "Starting parsing");

  if (responseData.substr(0, 5) == "ERROR") {
    _httpStatusCode = "999";
    _httpStatusText = responseData.substr(5, responseData.size()-5);
    _log.Add("Client handled error occured");
  } else {
    _pRawBuffer = new StringBufferHelper(responseData);
    parseHttpResponseData();
    _log.Add("HttpResponse", "Parsing of response went ok");
  }
}